

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O1

string * choc::text::createHexString<unsigned_char>
                   (string *__return_storage_ptr__,uchar v,int minNumDigits)

{
  bool bVar1;
  byte bVar2;
  char *pcVar4;
  char hex [40];
  char local_12 [10];
  uint uVar3;
  
  uVar3 = (uint)v;
  if (minNumDigits < 0x21) {
    pcVar4 = local_12 + 1;
    local_12[1] = 0;
    do {
      pcVar4[-1] = "0123456789abcdef"[uVar3 & 0xf];
      pcVar4 = pcVar4 + -1;
      bVar2 = (byte)uVar3;
      uVar3 = (uint)(bVar2 >> 4);
      bVar1 = 1 < minNumDigits;
      minNumDigits = minNumDigits + -1;
    } while (bVar1 || 0xf < bVar2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  soul::throwInternalCompilerError("minNumDigits <= 32","createHexString",0x9e);
}

Assistant:

std::string createHexString (IntegerType v, int minNumDigits)
{
    static_assert (std::is_integral<IntegerType>::value, "Need to pass integers into this method");
    auto value = static_cast<typename std::make_unsigned<IntegerType>::type> (v);
    CHOC_ASSERT (minNumDigits <= 32);

    char hex[40];
    const auto end = hex + sizeof (hex) - 1;
    auto d = end;
    *d = 0;

    for (;;)
    {
        *--d = "0123456789abcdef"[static_cast<uint32_t> (value) & 15u];
        value = static_cast<decltype (value)> (value >> 4);
        --minNumDigits;

        if (value == 0 && minNumDigits <= 0)
            return std::string (d, end);
    }
}